

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPServer.cpp
# Opt level: O2

void __thiscall UDPServer::respond<dto::Simple>(UDPServer *this,Poll *p,Simple *dto)

{
  ostream *poVar1;
  string resp_str;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>
  local_50;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"UDPServer: responding ");
  poVar1 = operator<<(poVar1,dto);
  std::endl<char,std::char_traits<char>>(poVar1);
  ::dto::marshall<dto::Simple>(&resp_str,dto);
  local_50.first._M_dataplus._M_p = (pointer)&local_50.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resp_str._M_dataplus._M_p == &resp_str.field_2) {
    local_50.first.field_2._8_8_ = resp_str.field_2._8_8_;
  }
  else {
    local_50.first._M_dataplus._M_p = resp_str._M_dataplus._M_p;
  }
  local_50.first._M_string_length = resp_str._M_string_length;
  resp_str._M_string_length = 0;
  resp_str.field_2._M_local_buf[0] = '\0';
  local_50.second.sin_family = (this->current_client).sin_family;
  local_50.second.sin_port = (this->current_client).sin_port;
  local_50.second.sin_addr.s_addr = (this->current_client).sin_addr.s_addr;
  local_50.second.sin_zero = *&(this->current_client).sin_zero;
  resp_str._M_dataplus._M_p = (pointer)&resp_str.field_2;
  std::
  deque<std::pair<std::__cxx11::string,sockaddr_in>,std::allocator<std::pair<std::__cxx11::string,sockaddr_in>>>
  ::emplace_back<std::pair<std::__cxx11::string,sockaddr_in>>
            ((deque<std::pair<std::__cxx11::string,sockaddr_in>,std::allocator<std::pair<std::__cxx11::string,sockaddr_in>>>
              *)&this->msg_queue,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  Subscriber::set_expected(&this->super_Subscriber,5);
  Poll::notify_subscriber_changed(p,&this->super_Subscriber);
  std::__cxx11::string::~string((string *)&resp_str);
  return;
}

Assistant:

void UDPServer::respond(Poll &p, T dto) {
  std::cout << "UDPServer: responding " << dto << std::endl;
  auto resp_str = dto::marshall(dto);
  msg_queue.emplace(std::make_pair(std::move(resp_str), current_client));
  set_expected(POLLIN | POLLOUT);
  p.notify_subscriber_changed(*this);
}